

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::MultiDraw(DeviceContextVkImpl *this,MultiDrawAttribs *Attribs)

{
  VkMultiDrawInfoEXT VVar1;
  VkMultiDrawInfoEXT *pVertexInfo;
  MultiDrawItem *pMVar2;
  MultiDrawItem *Item_1;
  Uint32 i_1;
  MultiDrawItem *Item;
  Uint32 i;
  Uint32 DrawCount;
  VkMultiDrawInfoEXT *pDrawInfo;
  MultiDrawAttribs *Attribs_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::MultiDraw
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  PrepareForDraw(this,Attribs->Flags);
  if (Attribs->NumInstances != 0) {
    if (((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NativeMultiDrawSupported & 1U) == 0
       ) {
      for (Item_1._4_4_ = 0; Item_1._4_4_ < Attribs->DrawCount; Item_1._4_4_ = Item_1._4_4_ + 1) {
        pMVar2 = Attribs->pDrawItems + Item_1._4_4_;
        if (pMVar2->NumVertices != 0) {
          VulkanUtilities::VulkanCommandBuffer::Draw
                    (&this->m_CommandBuffer,pMVar2->NumVertices,Attribs->NumInstances,
                     pMVar2->StartVertexLocation,Attribs->FirstInstanceLocation);
          (this->m_State).NumCommands = (this->m_State).NumCommands + 1;
        }
      }
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                  super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_ScratchSpace,
                 (ulong)Attribs->DrawCount << 3);
      pVertexInfo = (VkMultiDrawInfoEXT *)
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                              (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>)
                                .super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                                m_ScratchSpace);
      Item._4_4_ = 0;
      for (Item._0_4_ = 0; (uint)Item < Attribs->DrawCount; Item._0_4_ = (uint)Item + 1) {
        pMVar2 = Attribs->pDrawItems + (uint)Item;
        if (pMVar2->NumVertices != 0) {
          VVar1.vertexCount = pMVar2->NumVertices;
          VVar1.firstVertex = pMVar2->StartVertexLocation;
          pVertexInfo[(uint)Item] = VVar1;
          Item._4_4_ = Item._4_4_ + 1;
        }
      }
      if (Item._4_4_ != 0) {
        VulkanUtilities::VulkanCommandBuffer::MultiDraw
                  (&this->m_CommandBuffer,Item._4_4_,pVertexInfo,Attribs->NumInstances,
                   Attribs->FirstInstanceLocation);
      }
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::MultiDraw(const MultiDrawAttribs& Attribs)
{
    TDeviceContextBase::MultiDraw(Attribs, 0);

    PrepareForDraw(Attribs.Flags);

    if (Attribs.NumInstances == 0)
        return;

    if (m_NativeMultiDrawSupported)
    {
        m_ScratchSpace.resize(sizeof(VkMultiDrawInfoEXT) * Attribs.DrawCount);
        VkMultiDrawInfoEXT* pDrawInfo = reinterpret_cast<VkMultiDrawInfoEXT*>(m_ScratchSpace.data());

        Uint32 DrawCount = 0;
        for (Uint32 i = 0; i < Attribs.DrawCount; ++i)
        {
            const MultiDrawItem& Item = Attribs.pDrawItems[i];
            if (Item.NumVertices > 0)
            {
                pDrawInfo[i] = {Item.StartVertexLocation, Item.NumVertices};
                ++DrawCount;
            }
        }
        if (DrawCount > 0)
        {
            m_CommandBuffer.MultiDraw(DrawCount, pDrawInfo, Attribs.NumInstances, Attribs.FirstInstanceLocation);
        }
    }
    else
    {
        for (Uint32 i = 0; i < Attribs.DrawCount; ++i)
        {
            const MultiDrawItem& Item = Attribs.pDrawItems[i];
            if (Item.NumVertices > 0)
            {
                m_CommandBuffer.Draw(Item.NumVertices, Attribs.NumInstances, Item.StartVertexLocation, Attribs.FirstInstanceLocation);
                ++m_State.NumCommands;
            }
        }
    }
}